

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

ExpEmit __thiscall FxConcat::Emit(FxConcat *this,VMFunctionBuilder *build)

{
  FxExpression *pFVar1;
  PType *pPVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint extraout_var;
  uint extraout_var_00;
  int iVar6;
  byte bVar7;
  byte bVar8;
  char cVar9;
  ulong uVar10;
  VM_SHALF opbc;
  byte bVar11;
  uint uVar12;
  ExpEmit EVar13;
  bool bVar14;
  bool bVar15;
  uint local_48;
  uint local_44;
  uint local_40;
  
  uVar3 = (*((this->super_FxBinary).left)->_vptr_FxExpression[9])();
  uVar10 = CONCAT44(extraout_var,uVar3) >> 0x10;
  pFVar1 = (this->super_FxBinary).right;
  uVar4 = (*pFVar1->_vptr_FxExpression[9])(pFVar1,build);
  cVar9 = (char)(uVar3 >> 0x10);
  bVar11 = (byte)extraout_var;
  if (cVar9 == '\x02') {
    if ((extraout_var & 1) == 0) {
      local_40 = uVar3 >> 0x18;
      bVar14 = (extraout_var & 0x101) != 0;
      local_48 = uVar3;
      goto LAB_0052ce21;
    }
    local_48 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 2,1);
    VMFunctionBuilder::Emit(build,4,local_48 & 0xffff,(VM_SHALF)uVar3);
  }
  else {
    local_48 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 2,1);
    if ((extraout_var & 1) == 0) {
      uVar12 = uVar3 >> 0x18;
      bVar7 = (byte)(extraout_var >> 8) & 1;
    }
    else {
      uVar5 = VMFunctionBuilder::RegAvailability::Get
                        (build->Registers + (((ulong)uVar3 & 0xff0000) >> 0x10),1);
      iVar6 = 2;
      if (cVar9 != '\0') {
        iVar6 = (uint)(cVar9 != '\x01') * 2 + 3;
      }
      VMFunctionBuilder::Emit(build,iVar6,uVar5 & 0xffff,(VM_SHALF)uVar3);
      uVar10 = (ulong)(uVar3 >> 0x10);
      uVar12 = 1;
      bVar11 = 0;
      bVar7 = 0;
      uVar3 = uVar5;
    }
    bVar8 = (byte)uVar10;
    if (bVar8 == 1) {
      uVar5 = 6;
      if ((char)uVar12 != '\x01') {
        uVar5 = (char)uVar12 == '\x02' ^ 0x11;
      }
    }
    else {
      pPVar2 = ((this->super_FxBinary).left)->ValueType;
      if (pPVar2 == (PType *)TypeUInt32) {
        uVar5 = 3;
      }
      else if (pPVar2 == (PType *)TypeName) {
        uVar5 = 0xb;
      }
      else if (pPVar2 == (PType *)TypeSound) {
        uVar5 = 0xf;
      }
      else if (pPVar2 == (PType *)TypeColor) {
        uVar5 = 0xe;
      }
      else if (pPVar2 == (PType *)TypeSpriteID) {
        uVar5 = 0x12;
      }
      else if (pPVar2 == (PType *)TypeTextureID) {
        uVar5 = 0x13;
      }
      else {
        uVar5 = 7;
        if (bVar8 != 3) {
          if ((uVar10 & 0xff) != 0) {
            __assert_fail("false && \"Bad type for string concatenation\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                          ,0xf9c,"virtual ExpEmit FxConcat::Emit(VMFunctionBuilder *)");
          }
          uVar5 = 1;
        }
      }
    }
    VMFunctionBuilder::Emit(build,0x3e,local_48 & 0xffff,uVar3 & 0xffff,uVar5);
    if ((bVar7 == 0 && (bVar11 & 1) == 0) && bVar8 < 4) {
      VMFunctionBuilder::RegAvailability::Return
                (build->Registers + (uVar10 & 0xff),uVar3 & 0xffff,uVar12);
    }
  }
  local_40 = 1;
  bVar14 = false;
LAB_0052ce21:
  bVar11 = (byte)(uVar4 >> 0x10);
  bVar7 = (byte)extraout_var_00;
  opbc = (VM_SHALF)uVar4;
  if (bVar11 == 2) {
    bVar15 = (extraout_var_00 & 1) == 0;
    if (bVar15) {
      uVar12 = uVar4 >> 0x18;
      local_44 = uVar4;
    }
    else {
      uVar12 = 1;
      local_44 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 2,1);
      VMFunctionBuilder::Emit(build,4,local_44 & 0xffff,opbc);
    }
    bVar15 = bVar15 && (extraout_var_00 & 0x101) != 0;
  }
  else {
    local_44 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 2,1);
    if ((extraout_var_00 & 1) == 0) {
      uVar3 = uVar4 >> 0x18;
      bVar8 = (byte)(extraout_var_00 >> 8) & 1;
    }
    else {
      uVar4 = VMFunctionBuilder::RegAvailability::Get
                        (build->Registers + (((ulong)uVar4 & 0xff0000) >> 0x10),1);
      iVar6 = 2;
      if (bVar11 != 0) {
        iVar6 = (uint)(bVar11 != 1) * 2 + 3;
      }
      VMFunctionBuilder::Emit(build,iVar6,uVar4 & 0xffff,opbc);
      uVar3 = 1;
      bVar7 = 0;
      bVar8 = 0;
    }
    if (bVar11 == 1) {
      uVar12 = 6;
      if ((char)uVar3 != '\x01') {
        uVar12 = (char)uVar3 == '\x02' ^ 0x11;
      }
    }
    else {
      pPVar2 = ((this->super_FxBinary).right)->ValueType;
      if (pPVar2 == (PType *)TypeUInt32) {
        uVar12 = 3;
      }
      else if (pPVar2 == (PType *)TypeName) {
        uVar12 = 0xb;
      }
      else if (pPVar2 == (PType *)TypeSound) {
        uVar12 = 0xf;
      }
      else if (pPVar2 == (PType *)TypeColor) {
        uVar12 = 0xe;
      }
      else if (pPVar2 == (PType *)TypeSpriteID) {
        uVar12 = 0x12;
      }
      else if (pPVar2 == (PType *)TypeTextureID) {
        uVar12 = 0x13;
      }
      else {
        uVar12 = 7;
        if (bVar11 != 3) {
          if (bVar11 != 0) {
            __assert_fail("false && \"Bad type for string concatenation\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                          ,0xfbd,"virtual ExpEmit FxConcat::Emit(VMFunctionBuilder *)");
          }
          uVar12 = 1;
        }
      }
    }
    VMFunctionBuilder::Emit(build,0x3e,local_44 & 0xffff,uVar4 & 0xffff,uVar12);
    uVar12 = 1;
    if ((bVar8 == 0 && (bVar7 & 1) == 0) && bVar11 < 4) {
      VMFunctionBuilder::RegAvailability::Return(build->Registers + bVar11,uVar4 & 0xffff,uVar3);
    }
    bVar15 = false;
  }
  if (!bVar14) {
    VMFunctionBuilder::RegAvailability::Return(build->Registers + 2,local_48 & 0xffff,local_40);
  }
  if (!bVar15) {
    VMFunctionBuilder::RegAvailability::Return(build->Registers + 2,local_44 & 0xffff,uVar12);
  }
  uVar3 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 2,1);
  VMFunctionBuilder::Emit(build,0x57,uVar3 & 0xffff,local_48 & 0xffff,local_44 & 0xffff);
  EVar13._0_4_ = uVar3 & 0xffff | 0x1020000;
  EVar13.Konst = false;
  EVar13.Fixed = false;
  EVar13.Final = false;
  EVar13.Target = false;
  return EVar13;
}

Assistant:

ExpEmit FxConcat::Emit(VMFunctionBuilder *build)
{
	ExpEmit op1 = left->Emit(build);
	ExpEmit op2 = right->Emit(build);
	ExpEmit strng, strng2;

	if (op1.RegType == REGT_STRING && op1.Konst)
	{
		strng = ExpEmit(build, REGT_STRING);
		build->Emit(OP_LKS, strng.RegNum, op1.RegNum);
	}
	else if (op1.RegType == REGT_STRING)
	{
		strng = op1;
	}
	else
	{
		int cast;
		strng = ExpEmit(build, REGT_STRING);
		if (op1.Konst)
		{
			ExpEmit nonconst(build, op1.RegType);
			build->Emit(op1.RegType == REGT_INT ? OP_LK : op1.RegType == REGT_FLOAT ? OP_LKF : OP_LKP, nonconst.RegNum, op1.RegNum);
			op1 = nonconst;
		}
		if (op1.RegType == REGT_FLOAT) cast = op1.RegCount == 1 ? CAST_F2S : op1.RegCount == 2 ? CAST_V22S : CAST_V32S;
		else if (left->ValueType == TypeUInt32) cast = CAST_U2S;
		else if (left->ValueType == TypeName) cast = CAST_N2S;
		else if (left->ValueType == TypeSound) cast = CAST_So2S;
		else if (left->ValueType == TypeColor) cast = CAST_Co2S;
		else if (left->ValueType == TypeSpriteID) cast = CAST_SID2S;
		else if (left->ValueType == TypeTextureID) cast = CAST_TID2S;
		else if (op1.RegType == REGT_POINTER) cast = CAST_P2S;
		else if (op1.RegType == REGT_INT) cast = CAST_I2S;
		else assert(false && "Bad type for string concatenation");
		build->Emit(OP_CAST, strng.RegNum, op1.RegNum, cast);
		op1.Free(build);
	}

	if (op2.RegType == REGT_STRING && op2.Konst)
	{
		strng2 = ExpEmit(build, REGT_STRING);
		build->Emit(OP_LKS, strng2.RegNum, op2.RegNum);
	}
	else if (op2.RegType == REGT_STRING)
	{
		strng2 = op2;
	}
	else
	{
		int cast;
		strng2 = ExpEmit(build, REGT_STRING);
		if (op2.Konst)
		{
			ExpEmit nonconst(build, op2.RegType);
			build->Emit(op2.RegType == REGT_INT ? OP_LK : op2.RegType == REGT_FLOAT ? OP_LKF : OP_LKP, nonconst.RegNum, op2.RegNum);
			op2 = nonconst;
		}
		if (op2.RegType == REGT_FLOAT) cast = op2.RegCount == 1 ? CAST_F2S : op2.RegCount == 2 ? CAST_V22S : CAST_V32S;
		else if (right->ValueType == TypeUInt32) cast = CAST_U2S;
		else if (right->ValueType == TypeName) cast = CAST_N2S;
		else if (right->ValueType == TypeSound) cast = CAST_So2S;
		else if (right->ValueType == TypeColor) cast = CAST_Co2S;
		else if (right->ValueType == TypeSpriteID) cast = CAST_SID2S;
		else if (right->ValueType == TypeTextureID) cast = CAST_TID2S;
		else if (op2.RegType == REGT_POINTER) cast = CAST_P2S;
		else if (op2.RegType == REGT_INT) cast = CAST_I2S;
		else assert(false && "Bad type for string concatenation");
		build->Emit(OP_CAST, strng2.RegNum, op2.RegNum, cast);
		op2.Free(build);
	}
	strng.Free(build);
	strng2.Free(build);
	ExpEmit dest(build, REGT_STRING);
	assert(strng.RegType == strng2.RegType && strng.RegType == REGT_STRING);
	build->Emit(OP_CONCAT, dest.RegNum, strng.RegNum, strng2.RegNum);
	return dest;
}